

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O0

bool __thiscall
ON_ArithmeticCalculatorImplementation::DecreaseExpressionDepth
          (ON_ArithmeticCalculatorImplementation *this)

{
  bool bVar1;
  ARITHMETIC_OP AVar2;
  uint previous_pending_op;
  uint pending_op;
  ON_ArithmeticCalculatorImplementation *this_local;
  
  if (this->m_error_condition == '\0') {
    if (this->m_expression_depth < 2) {
      SetErrorCondition(this,invalid_expression_error);
      this_local._7_1_ = false;
    }
    else if (this->m_expression_depth == this->m_op_stack[this->m_op_stack_pointer].m_level) {
      this->m_bPendingImpliedMultiplication = '\0';
      AVar2 = ArithmeticOperationIsPending(this);
      if (AVar2 != op_unset) {
        if (AVar2 != op_add && AVar2 != op_sub) {
          SetErrorCondition(this,invalid_expression_error);
          return false;
        }
        bVar1 = EvaluatePendingArithmeticOperation(this);
        if (!bVar1) {
          return false;
        }
      }
      if (this->m_expression_depth == this->m_op_stack[this->m_op_stack_pointer].m_level) {
        if (this->m_op_stack[this->m_op_stack_pointer].m_op == op_number) {
          this->m_expression_depth = this->m_expression_depth - 1;
          this->m_op_stack[this->m_op_stack_pointer].m_level = this->m_expression_depth;
          AVar2 = ArithmeticOperationIsPending(this);
          if ((AVar2 != op_mult && AVar2 != op_div) ||
             (bVar1 = EvaluatePendingArithmeticOperation(this), bVar1)) {
            this->m_bPendingImpliedMultiplication = this->m_bImpliedMultiplicationEnabled;
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          SetErrorCondition(this,invalid_expression_error);
          this_local._7_1_ = false;
        }
      }
      else {
        SetErrorCondition(this,invalid_expression_error);
        this_local._7_1_ = false;
      }
    }
    else {
      SetErrorCondition(this,invalid_expression_error);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ArithmeticCalculatorImplementation::DecreaseExpressionDepth()
{
  if (m_error_condition)
    return false;

  if ( m_expression_depth <= 1 )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;
  }

  if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  m_bPendingImpliedMultiplication = false;

  const unsigned int pending_op = ArithmeticOperationIsPending();
  switch(pending_op)
  {
  case ON_ArithmeticCalculatorImplementation::op_add:
  case ON_ArithmeticCalculatorImplementation::op_sub:
    if ( !EvaluatePendingArithmeticOperation() )
      return false;
    break;

  case ON_ArithmeticCalculatorImplementation::op_unset:
    // empty case
    break;

  default:
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;
    break;
  }

  if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  if ( ON_ArithmeticCalculatorImplementation::op_number != m_op_stack[m_op_stack_pointer].m_op )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  m_expression_depth--;
  m_op_stack[m_op_stack_pointer].m_level = m_expression_depth;

  const unsigned int previous_pending_op = ArithmeticOperationIsPending();
  switch(previous_pending_op)
  {
  case ON_ArithmeticCalculatorImplementation::op_mult:
  case ON_ArithmeticCalculatorImplementation::op_div:
    if ( !EvaluatePendingArithmeticOperation() )
      return false;
    break;
  }

  m_bPendingImpliedMultiplication = m_bImpliedMultiplicationEnabled;

  return true;
}